

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O0

FT_Error ps_parser_to_bytes(PS_Parser parser,FT_Byte *bytes,FT_Offset max_bytes,FT_ULong *pnum_bytes
                           ,FT_Bool delimiters)

{
  FT_UInt FVar1;
  FT_Byte *local_38;
  FT_Byte *cur;
  FT_Error error;
  FT_Bool delimiters_local;
  FT_ULong *pnum_bytes_local;
  FT_Offset max_bytes_local;
  FT_Byte *bytes_local;
  PS_Parser parser_local;
  
  cur._0_4_ = 0;
  cur._7_1_ = delimiters;
  _error = pnum_bytes;
  pnum_bytes_local = (FT_ULong *)max_bytes;
  max_bytes_local = (FT_Offset)bytes;
  bytes_local = (FT_Byte *)parser;
  ps_parser_skip_spaces(parser);
  local_38 = *(FT_Byte **)bytes_local;
  if (local_38 < *(FT_Byte **)(bytes_local + 0x10)) {
    if (cur._7_1_ != '\0') {
      if (*local_38 != '<') {
        return 3;
      }
      local_38 = local_38 + 1;
    }
    FVar1 = PS_Conv_ASCIIHexDecode
                      (&local_38,*(FT_Byte **)(bytes_local + 0x10),(FT_Byte *)max_bytes_local,
                       (FT_Offset)pnum_bytes_local);
    *_error = (ulong)FVar1;
    *(FT_Byte **)bytes_local = local_38;
    if (cur._7_1_ != '\0') {
      if ((local_38 < *(FT_Byte **)(bytes_local + 0x10)) && (*local_38 != '>')) {
        cur._0_4_ = 3;
      }
      else {
        *(long *)bytes_local = *(long *)bytes_local + 1;
      }
    }
  }
  return (FT_Error)cur;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  ps_parser_to_bytes( PS_Parser  parser,
                      FT_Byte*   bytes,
                      FT_Offset  max_bytes,
                      FT_ULong*  pnum_bytes,
                      FT_Bool    delimiters )
  {
    FT_Error  error = FT_Err_Ok;
    FT_Byte*  cur;


    ps_parser_skip_spaces( parser );
    cur = parser->cursor;

    if ( cur >= parser->limit )
      goto Exit;

    if ( delimiters )
    {
      if ( *cur != '<' )
      {
        FT_ERROR(( "ps_parser_to_bytes: Missing starting delimiter `<'\n" ));
        error = FT_THROW( Invalid_File_Format );
        goto Exit;
      }

      cur++;
    }

    *pnum_bytes = PS_Conv_ASCIIHexDecode( &cur,
                                          parser->limit,
                                          bytes,
                                          max_bytes );

    parser->cursor = cur;

    if ( delimiters )
    {
      if ( cur < parser->limit && *cur != '>' )
      {
        FT_ERROR(( "ps_parser_to_bytes: Missing closing delimiter `>'\n" ));
        error = FT_THROW( Invalid_File_Format );
        goto Exit;
      }

      parser->cursor++;
    }

  Exit:
    return error;
  }